

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O3

ma_int16 *
ma_dr_flac__full_read_and_close_s16
          (ma_dr_flac *pFlac,uint *channelsOut,uint *sampleRateOut,ma_uint64 *totalPCMFrameCountOut)

{
  ma_allocation_callbacks *pAllocationCallbacks;
  _func_void_ptr_size_t_void_ptr *p_Var1;
  _func_void_ptr_void_ptr_size_t_void_ptr *p_Var2;
  _func_void_void_ptr_void_ptr *p_Var3;
  ma_uint64 mVar4;
  ma_uint64 mVar5;
  ma_int16 *pmVar6;
  long lVar7;
  ulong uVar8;
  size_t sVar9;
  ma_uint64 mVar10;
  ma_int16 buffer [4096];
  ma_int16 *local_2068;
  ma_int16 local_2038 [4100];
  
  if (pFlac->totalPCMFrameCount == 0) {
    pAllocationCallbacks = &pFlac->allocationCallbacks;
    p_Var1 = (pFlac->allocationCallbacks).onMalloc;
    if (p_Var1 == (_func_void_ptr_size_t_void_ptr *)0x0) {
      p_Var2 = (pFlac->allocationCallbacks).onRealloc;
      if (p_Var2 == (_func_void_ptr_void_ptr_size_t_void_ptr *)0x0) goto LAB_0017760c;
      local_2068 = (ma_int16 *)(*p_Var2)((void *)0x0,0x2000,pAllocationCallbacks->pUserData);
    }
    else {
      local_2068 = (ma_int16 *)(*p_Var1)(0x2000,pAllocationCallbacks->pUserData);
    }
    if (local_2068 == (ma_int16 *)0x0) goto LAB_0017760c;
    mVar5 = ma_dr_flac_read_pcm_frames_s16
                      (pFlac,(ulong)(ushort)(0x1000 / pFlac->channels),local_2038);
    if (mVar5 == 0) {
      sVar9 = 0x2000;
      mVar4 = 0;
    }
    else {
      sVar9 = 0x2000;
      mVar10 = 0;
      do {
        mVar4 = mVar10 + mVar5;
        uVar8 = (ulong)pFlac->channels;
        if (sVar9 < mVar4 * uVar8 * 2) {
          pmVar6 = (ma_int16 *)
                   ma_dr_flac__realloc_from_callbacks
                             (local_2068,sVar9 * 2,sVar9,pAllocationCallbacks);
          if (pmVar6 == (ma_int16 *)0x0) {
            if ((local_2068 != (ma_int16 *)0x0) &&
               (p_Var3 = (pFlac->allocationCallbacks).onFree,
               p_Var3 != (_func_void_void_ptr_void_ptr *)0x0)) {
              (*p_Var3)(local_2068,pAllocationCallbacks->pUserData);
            }
            goto LAB_0017760c;
          }
          uVar8 = (ulong)pFlac->channels;
          local_2068 = pmVar6;
          sVar9 = sVar9 * 2;
        }
        memcpy(local_2068 + mVar10 * uVar8,local_2038,mVar5 * uVar8 * 2);
        mVar5 = ma_dr_flac_read_pcm_frames_s16
                          (pFlac,(ulong)(ushort)(0x1000 / pFlac->channels),local_2038);
        mVar10 = mVar4;
      } while (mVar5 != 0);
    }
    lVar7 = pFlac->channels * mVar4;
    memset(local_2068 + lVar7,0,sVar9 + lVar7 * -2);
  }
  else {
    sVar9 = pFlac->totalPCMFrameCount * (ulong)pFlac->channels * 2;
    p_Var1 = (pFlac->allocationCallbacks).onMalloc;
    if (p_Var1 == (_func_void_ptr_size_t_void_ptr *)0x0) {
      p_Var2 = (pFlac->allocationCallbacks).onRealloc;
      if (p_Var2 == (_func_void_ptr_void_ptr_size_t_void_ptr *)0x0) goto LAB_0017760c;
      local_2068 = (ma_int16 *)(*p_Var2)((void *)0x0,sVar9,(pFlac->allocationCallbacks).pUserData);
    }
    else {
      local_2068 = (ma_int16 *)(*p_Var1)(sVar9,(pFlac->allocationCallbacks).pUserData);
    }
    if (local_2068 == (ma_int16 *)0x0) {
LAB_0017760c:
      local_2068 = (ma_int16 *)0x0;
      goto LAB_0017760f;
    }
    mVar4 = ma_dr_flac_read_pcm_frames_s16(pFlac,pFlac->totalPCMFrameCount,local_2068);
  }
  if (sampleRateOut != (uint *)0x0) {
    *sampleRateOut = pFlac->sampleRate;
  }
  if (channelsOut != (uint *)0x0) {
    *channelsOut = (uint)pFlac->channels;
  }
  if (totalPCMFrameCountOut != (ma_uint64 *)0x0) {
    *totalPCMFrameCountOut = mVar4;
  }
LAB_0017760f:
  ma_dr_flac_close(pFlac);
  return local_2068;
}

Assistant:

ma_int32* ma_dr_flac_open_and_read_pcm_frames_s32(ma_dr_flac_read_proc onRead, ma_dr_flac_seek_proc onSeek, void* pUserData, unsigned int* channelsOut, unsigned int* sampleRateOut, ma_uint64* totalPCMFrameCountOut, const ma_allocation_callbacks* pAllocationCallbacks)
{
    ma_dr_flac* pFlac;
    if (channelsOut) {
        *channelsOut = 0;
    }
    if (sampleRateOut) {
        *sampleRateOut = 0;
    }
    if (totalPCMFrameCountOut) {
        *totalPCMFrameCountOut = 0;
    }
    pFlac = ma_dr_flac_open(onRead, onSeek, pUserData, pAllocationCallbacks);
    if (pFlac == NULL) {
        return NULL;
    }
    return ma_dr_flac__full_read_and_close_s32(pFlac, channelsOut, sampleRateOut, totalPCMFrameCountOut);
}